

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::utility::operator>>(basic_istream<char,_std::char_traits<char>_> *in,delim_str *d)

{
  size_t sVar1;
  long *plVar2;
  size_t sVar3;
  char c;
  
  sVar1 = strlen(d->str);
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      plVar2 = (long *)std::istream::get((char *)in);
      if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) &&
         (d->str[sVar3] != '\0')) {
        std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
        return in;
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, const delim_str &d) {
        char_t c{0};
        std::size_t len{std::strlen(d.str)}, i{0};
        while (i < len and not(in.get(c) and c != d.str[i])) {
          ++i;
        }
        if (i < len)
          in.setstate(std::ios::failbit);
        return in;
      }